

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  void *pvVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  int *piVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  ulong uVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  float *pfVar38;
  int iVar39;
  undefined1 (*pauVar40) [16];
  int iVar41;
  int j;
  int j_1;
  long lVar42;
  int j_2;
  float *pfVar43;
  bool bVar44;
  undefined1 extraout_var [12];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  v4sf one;
  float fVar67;
  float fVar68;
  float fVar78;
  float fVar79;
  undefined1 auVar70 [16];
  float fVar80;
  undefined1 auVar71 [16];
  float fVar69;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  v4sf one_4;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int local_b8;
  Mat local_98;
  long local_48;
  void *local_40;
  ulong local_38;
  
  uVar33 = bottom_blob->elemsize;
  iVar3 = bottom_blob->elempack;
  p_Var5 = this->_vptr_Convolution1D_x86[-3];
  iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var5);
  iVar34 = *(int *)(&this->field_0xd8 + (long)p_Var5);
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86 + (long)p_Var5),bottom_blob,
             &local_98,opt);
  iVar29 = local_98.h;
  local_b8 = -100;
  if ((local_98.data != (void *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
    bVar32 = (*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) & 3) == 0 &
             opt->use_packing_layout;
    iVar41 = (uint)bVar32 + (uint)bVar32 * 2 + 1;
    iVar4 = (~((iVar4 + -1) * iVar34) + local_98.w) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86[-3]);
    uVar31 = (long)(int)*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) /
             (long)iVar41;
    uVar30 = uVar31 & 0xffffffff;
    iVar34 = (int)uVar31;
    Mat::create(top_blob,iVar4 + 1,iVar34,uVar33 / (ulong)(long)iVar3 << bVar32 * '\x02',iVar41,
                opt->blob_allocator);
    auVar62 = _DAT_004c5c40;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      bVar32 = bVar32 ^ 1;
      if (iVar3 == 4 && bVar32 == 0) {
        uVar33 = 0;
        if (0 < iVar29) {
          uVar33 = (ulong)(uint)iVar29;
        }
        uVar31 = 0;
        if (0 < iVar34) {
          uVar31 = uVar30;
        }
        fVar64 = (float)DAT_004c5c40;
        fVar65 = DAT_004c5c40._4_4_;
        fVar66 = DAT_004c5c40._8_4_;
        fVar67 = DAT_004c5c40._12_4_;
        for (uVar37 = 0; uVar37 != uVar31; uVar37 = uVar37 + 1) {
          pauVar40 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar37 * top_blob->elemsize + (long)top_blob->data);
          pp_Var6 = this->_vptr_Convolution1D_x86;
          for (iVar41 = 0; auVar72 = ZEXT816(0), iVar41 <= iVar4; iVar41 = iVar41 + 1) {
            p_Var5 = pp_Var6[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
              auVar56 = ZEXT816(0);
            }
            else {
              auVar56 = *(undefined1 (*) [16])
                         (*(long *)(&this->field_0x190 + (long)p_Var5) + uVar37 * 0x10);
            }
            pfVar43 = (float *)((this->weight_data_packed).cstep * uVar37 *
                                (this->weight_data_packed).elemsize +
                               (long)(this->weight_data_packed).data);
            for (uVar36 = 0; uVar36 != uVar33; uVar36 = uVar36 + 1) {
              p_Var7 = this->_vptr_Convolution1D_x86[-3];
              pfVar38 = (float *)((long)local_98.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar41 * 4) * 4
                                 + (long)local_98.w *
                                   CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                                   uVar36);
              iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
              if (*(int *)(&this->field_0xd4 + (long)p_Var7) < 1) {
                iVar39 = 0;
              }
              while (bVar44 = iVar39 != 0, iVar39 = iVar39 + -1, bVar44) {
                fVar52 = *pfVar38;
                fVar69 = pfVar38[1];
                fVar81 = pfVar38[2];
                fVar82 = pfVar38[3];
                pfVar20 = pfVar43 + 2;
                pfVar21 = pfVar43 + 3;
                pfVar22 = pfVar43 + 6;
                pfVar23 = pfVar43 + 7;
                pfVar24 = pfVar43 + 10;
                pfVar25 = pfVar43 + 0xb;
                pfVar26 = pfVar43 + 0xe;
                pfVar27 = pfVar43 + 0xf;
                fVar83 = auVar56._0_4_;
                fVar84 = auVar56._8_4_;
                fVar68 = auVar56._12_4_;
                auVar56._4_4_ =
                     pfVar43[1] * fVar52 + auVar56._4_4_ + pfVar43[9] * fVar81 + pfVar43[5] * fVar69
                     + pfVar43[0xd] * fVar82;
                auVar56._0_4_ =
                     *pfVar43 * fVar52 + fVar83 + pfVar43[8] * fVar81 + pfVar43[4] * fVar69 +
                     pfVar43[0xc] * fVar82;
                pfVar38 = pfVar38 + (long)*(int *)(&this->field_0xd8 + (long)p_Var7) * 4;
                pfVar43 = pfVar43 + 0x10;
                auVar56._8_4_ =
                     *pfVar20 * fVar52 + fVar84 + *pfVar24 * fVar81 + *pfVar22 * fVar69 +
                     *pfVar26 * fVar82;
                auVar56._12_4_ =
                     *pfVar21 * fVar52 + fVar68 + *pfVar25 * fVar81 + *pfVar23 * fVar69 +
                     *pfVar27 * fVar82;
              }
            }
            fVar52 = auVar56._8_4_;
            fVar69 = auVar56._12_4_;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var5) - 1U) goto LAB_004a11a8;
            auVar70 = maxps(auVar56,auVar72);
            auVar46 = auVar70;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
            case 2:
              auVar72 = minps(auVar56,auVar72);
              fVar52 = **(float **)(&this->field_0xf8 + (long)p_Var5);
              auVar46._0_4_ = auVar70._0_4_ + fVar52 * auVar72._0_4_;
              auVar46._4_4_ = auVar70._4_4_ + fVar52 * auVar72._4_4_;
              auVar46._8_4_ = auVar70._8_4_ + fVar52 * auVar72._8_4_;
              auVar46._12_4_ = auVar70._12_4_ + fVar52 * auVar72._12_4_;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
              uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
              auVar55._4_4_ = uVar1;
              auVar55._0_4_ = uVar1;
              auVar55._8_4_ = uVar1;
              auVar55._12_4_ = uVar1;
              auVar71._4_4_ = uVar2;
              auVar71._0_4_ = uVar2;
              auVar71._8_4_ = uVar2;
              auVar71._12_4_ = uVar2;
              auVar72 = maxps(auVar56,auVar55);
              auVar46 = minps(auVar72,auVar71);
              break;
            case 4:
              auVar47._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
              auVar47._8_4_ = -fVar52;
              auVar47._12_4_ = -fVar69;
              auVar72 = minps(auVar47,_DAT_004c5c00);
              auVar72 = maxps(auVar72,_DAT_004c5c10);
              fVar69 = auVar72._0_4_ * 1.442695 + 0.5;
              fVar82 = auVar72._4_4_ * 1.442695 + 0.5;
              fVar84 = auVar72._8_4_ * 1.442695 + 0.5;
              fVar78 = auVar72._12_4_ * 1.442695 + 0.5;
              fVar52 = (float)(int)fVar69;
              fVar81 = (float)(int)fVar82;
              fVar83 = (float)(int)fVar84;
              fVar68 = (float)(int)fVar78;
              fVar52 = fVar52 - (float)(-(uint)(fVar69 < fVar52) & (uint)fVar64);
              fVar81 = fVar81 - (float)(-(uint)(fVar82 < fVar81) & (uint)fVar65);
              fVar83 = fVar83 - (float)(-(uint)(fVar84 < fVar83) & (uint)fVar66);
              fVar68 = fVar68 - (float)(-(uint)(fVar78 < fVar68) & (uint)fVar67);
              fVar69 = fVar52 * -0.6931472 + auVar72._0_4_;
              fVar82 = fVar81 * -0.6931472 + auVar72._4_4_;
              fVar84 = fVar83 * -0.6931472 + auVar72._8_4_;
              fVar78 = fVar68 * -0.6931472 + auVar72._12_4_;
              auVar48._0_4_ = fVar69 * fVar69;
              auVar48._4_4_ = fVar82 * fVar82;
              auVar48._8_4_ = fVar84 * fVar84;
              auVar48._12_4_ = fVar78 * fVar78;
              fVar79 = (float)((int)fVar52 * 0x800000 + (int)fVar64) *
                       (fVar69 + fVar64 +
                       (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69
                         + 0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * auVar48._0_4_) +
                       fVar64;
              fVar80 = (float)((int)fVar81 * 0x800000 + (int)fVar65) *
                       (fVar82 + fVar65 +
                       (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82
                         + 0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5) * auVar48._4_4_) +
                       fVar65;
              fVar83 = (float)((int)fVar83 * 0x800000 + (int)fVar66) *
                       (fVar84 + fVar66 +
                       (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84
                         + 0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5) * auVar48._8_4_) +
                       fVar66;
              fVar84 = (float)((int)fVar68 * 0x800000 + (int)fVar67) *
                       (fVar78 + fVar67 +
                       (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78
                         + 0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5) * auVar48._12_4_) +
                       fVar67;
              auVar15._4_4_ = fVar80;
              auVar15._0_4_ = fVar79;
              auVar15._8_4_ = fVar83;
              auVar15._12_4_ = fVar84;
              auVar72 = rcpps(auVar48,auVar15);
              fVar52 = auVar72._0_4_;
              fVar69 = auVar72._4_4_;
              fVar81 = auVar72._8_4_;
              fVar82 = auVar72._12_4_;
              auVar46._0_4_ = (fVar64 - fVar79 * fVar52) * fVar52 + fVar52;
              auVar46._4_4_ = (fVar65 - fVar80 * fVar69) * fVar69 + fVar69;
              auVar46._8_4_ = (fVar66 - fVar83 * fVar81) * fVar81 + fVar81;
              auVar46._12_4_ = (fVar67 - fVar84 * fVar82) * fVar82 + fVar82;
              break;
            case 5:
              auVar72 = minps(auVar56,_DAT_004c5c00);
              auVar72 = maxps(auVar72,_DAT_004c5c10);
              fVar81 = auVar72._0_4_ * 1.442695 + 0.5;
              fVar82 = auVar72._4_4_ * 1.442695 + 0.5;
              fVar83 = auVar72._8_4_ * 1.442695 + 0.5;
              fVar84 = auVar72._12_4_ * 1.442695 + 0.5;
              fVar68 = (float)(int)fVar81;
              fVar78 = (float)(int)fVar82;
              fVar79 = (float)(int)fVar83;
              fVar80 = (float)(int)fVar84;
              fVar68 = fVar68 - (float)(-(uint)(fVar81 < fVar68) & (uint)fVar64);
              fVar78 = fVar78 - (float)(-(uint)(fVar82 < fVar78) & (uint)fVar65);
              fVar79 = fVar79 - (float)(-(uint)(fVar83 < fVar79) & (uint)fVar66);
              fVar80 = fVar80 - (float)(-(uint)(fVar84 < fVar80) & (uint)fVar67);
              fVar81 = auVar72._0_4_ - fVar68 * 0.6931472;
              fVar82 = auVar72._4_4_ - fVar78 * 0.6931472;
              fVar83 = auVar72._8_4_ - fVar79 * 0.6931472;
              fVar84 = auVar72._12_4_ - fVar80 * 0.6931472;
              auVar85._0_4_ =
                   (float)((int)fVar68 * 0x800000 + (int)fVar64) *
                   (fVar81 + fVar64 +
                   (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
                     0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81) + fVar64
              ;
              auVar85._4_4_ =
                   (float)((int)fVar78 * 0x800000 + (int)fVar65) *
                   (fVar82 + fVar65 +
                   (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
                     0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5) * fVar82 * fVar82) + fVar65
              ;
              auVar85._8_4_ =
                   (float)((int)fVar79 * 0x800000 + (int)fVar66) *
                   (fVar83 + fVar66 +
                   (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                     0.041665796) * fVar83 + 0.16666666) * fVar83 + 0.5) * fVar83 * fVar83) + fVar66
              ;
              auVar85._12_4_ =
                   (float)((int)fVar80 * 0x800000 + (int)fVar67) *
                   (fVar84 + fVar67 +
                   (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                     0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5) * fVar84 * fVar84) + fVar67
              ;
              auVar72 = maxps(auVar85,_DAT_004c5cb0);
              fVar81 = (float)(auVar72._0_4_ & 0x807fffff | 0x3f000000);
              fVar83 = (float)(auVar72._4_4_ & 0x807fffff | 0x3f000000);
              fVar68 = (float)(auVar72._8_4_ & 0x807fffff | 0x3f000000);
              fVar79 = (float)(auVar72._12_4_ & 0x807fffff | 0x3f000000);
              fVar82 = fVar81 + -1.0 + (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar81);
              fVar84 = fVar83 + -1.0 + (float)(-(uint)(fVar83 < 0.70710677) & (uint)fVar83);
              fVar78 = fVar68 + -1.0 + (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar68);
              fVar80 = fVar79 + -1.0 + (float)(-(uint)(fVar79 < 0.70710677) & (uint)fVar79);
              auVar53._0_8_ =
                   CONCAT44(-(uint)(auVar85._4_4_ <= 0.0),-(uint)(auVar85._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar53._8_4_ = -(uint)(auVar85._8_4_ <= 0.0) & 0x7fffffff;
              auVar53._12_4_ = -(uint)(auVar85._12_4_ <= 0.0) & 0x7fffffff;
              auVar12._4_4_ =
                   ~-(uint)(auVar85._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar72._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar83 < 0.70710677) & (uint)fVar65)) * 0.6931472 +
                           fVar84 + (((((((((fVar84 * 0.070376836 + -0.1151461) * fVar84 +
                                           0.116769984) * fVar84 + -0.12420141) * fVar84 +
                                         0.14249323) * fVar84 + -0.16668057) * fVar84 + 0.20000714)
                                       * fVar84 + -0.24999994) * fVar84 + 0.3333333) * fVar84 + -0.5
                                    ) * fVar84 * fVar84) * -2.0);
              auVar12._0_4_ =
                   ~-(uint)(auVar85._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar72._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar64)) * 0.6931472 +
                           fVar82 + (((((((((fVar82 * 0.070376836 + -0.1151461) * fVar82 +
                                           0.116769984) * fVar82 + -0.12420141) * fVar82 +
                                         0.14249323) * fVar82 + -0.16668057) * fVar82 + 0.20000714)
                                       * fVar82 + -0.24999994) * fVar82 + 0.3333333) * fVar82 + -0.5
                                    ) * fVar82 * fVar82) * -2.0);
              auVar12._8_4_ =
                   ~-(uint)(auVar85._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar72._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar66)) * 0.6931472 +
                           fVar78 + (((((((((fVar78 * 0.070376836 + -0.1151461) * fVar78 +
                                           0.116769984) * fVar78 + -0.12420141) * fVar78 +
                                         0.14249323) * fVar78 + -0.16668057) * fVar78 + 0.20000714)
                                       * fVar78 + -0.24999994) * fVar78 + 0.3333333) * fVar78 + -0.5
                                    ) * fVar78 * fVar78) * -2.0);
              auVar12._12_4_ =
                   ~-(uint)(auVar85._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar72._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar79 < 0.70710677) & (uint)fVar67)) * 0.6931472 +
                           fVar80 + (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 +
                                           0.116769984) * fVar80 + -0.12420141) * fVar80 +
                                         0.14249323) * fVar80 + -0.16668057) * fVar80 + 0.20000714)
                                       * fVar80 + -0.24999994) * fVar80 + 0.3333333) * fVar80 + -0.5
                                    ) * fVar80 * fVar80) * -2.0);
              auVar72 = minps(auVar53 | auVar12,_DAT_004c5c00);
              auVar72 = maxps(auVar72,_DAT_004c5c10);
              fVar81 = auVar72._0_4_ * 1.442695 + 0.5;
              fVar82 = auVar72._4_4_ * 1.442695 + 0.5;
              fVar83 = auVar72._8_4_ * 1.442695 + 0.5;
              fVar84 = auVar72._12_4_ * 1.442695 + 0.5;
              fVar68 = (float)(int)fVar81;
              fVar78 = (float)(int)fVar82;
              fVar79 = (float)(int)fVar83;
              fVar80 = (float)(int)fVar84;
              fVar68 = fVar68 - (float)(-(uint)(fVar81 < fVar68) & (uint)fVar64);
              fVar78 = fVar78 - (float)(-(uint)(fVar82 < fVar78) & (uint)fVar65);
              fVar79 = fVar79 - (float)(-(uint)(fVar83 < fVar79) & (uint)fVar66);
              fVar80 = fVar80 - (float)(-(uint)(fVar84 < fVar80) & (uint)fVar67);
              fVar81 = auVar72._0_4_ - fVar68 * 0.6931472;
              fVar82 = auVar72._4_4_ - fVar78 * 0.6931472;
              fVar83 = auVar72._8_4_ - fVar79 * 0.6931472;
              fVar84 = auVar72._12_4_ - fVar80 * 0.6931472;
              auVar54._0_4_ =
                   fVar81 + fVar64 +
                   (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
                     0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81;
              auVar54._4_4_ =
                   fVar82 + fVar65 +
                   (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
                     0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5) * fVar82 * fVar82;
              auVar54._8_4_ =
                   fVar83 + fVar66 +
                   (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                     0.041665796) * fVar83 + 0.16666666) * fVar83 + 0.5) * fVar83 * fVar83;
              auVar54._12_4_ =
                   fVar84 + fVar67 +
                   (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                     0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5) * fVar84 * fVar84;
              fVar68 = (float)((int)fVar68 * 0x800000 + (int)fVar64) * auVar54._0_4_ + fVar64;
              fVar78 = (float)((int)fVar78 * 0x800000 + (int)fVar65) * auVar54._4_4_ + fVar65;
              fVar79 = (float)((int)fVar79 * 0x800000 + (int)fVar66) * auVar54._8_4_ + fVar66;
              fVar80 = (float)((int)fVar80 * 0x800000 + (int)fVar67) * auVar54._12_4_ + fVar67;
              auVar14._4_4_ = fVar78;
              auVar14._0_4_ = fVar68;
              auVar14._8_4_ = fVar79;
              auVar14._12_4_ = fVar80;
              auVar72 = rcpps(auVar54,auVar14);
              fVar81 = auVar72._0_4_;
              fVar82 = auVar72._4_4_;
              fVar83 = auVar72._8_4_;
              fVar84 = auVar72._12_4_;
              auVar72._0_4_ = fVar81 + fVar81 + -1.0 + (2.0 - fVar68 * (fVar81 + fVar81)) * fVar81;
              auVar72._4_4_ = fVar82 + fVar82 + -1.0 + (2.0 - fVar78 * (fVar82 + fVar82)) * fVar82;
              auVar72._8_4_ = fVar83 + fVar83 + -1.0 + (2.0 - fVar79 * (fVar83 + fVar83)) * fVar83;
              auVar72._12_4_ = fVar84 + fVar84 + -1.0 + (2.0 - fVar80 * (fVar84 + fVar84)) * fVar84;
              goto LAB_004a11a0;
            case 6:
              fVar81 = **(float **)(&this->field_0xf8 + (long)p_Var5);
              fVar82 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
              auVar70._0_4_ = fVar81 * auVar56._0_4_ + fVar82;
              auVar70._4_4_ = fVar81 * auVar56._4_4_ + fVar82;
              auVar70._8_4_ = fVar81 * fVar52 + fVar82;
              auVar70._12_4_ = fVar81 * fVar69 + fVar82;
              auVar72 = maxps(auVar70,auVar72);
              auVar72 = minps(auVar72,auVar62);
LAB_004a11a0:
              auVar46._0_4_ = auVar72._0_4_ * auVar56._0_4_;
              auVar46._4_4_ = auVar72._4_4_ * auVar56._4_4_;
              auVar46._8_4_ = auVar72._8_4_ * fVar52;
              auVar46._12_4_ = auVar72._12_4_ * fVar69;
            }
            auVar56 = auVar46;
LAB_004a11a8:
            *pauVar40 = auVar56;
            pauVar40 = pauVar40 + 1;
          }
        }
      }
      auVar72 = _DAT_004c5c40;
      auVar62 = _DAT_004c5c00;
      if (iVar3 == 1 && bVar32 == 0) {
        uVar33 = 0;
        if (0 < iVar29) {
          uVar33 = (ulong)(uint)iVar29;
        }
        uVar31 = 0;
        if (0 < iVar34) {
          uVar31 = uVar30;
        }
        fVar64 = (float)DAT_004c5c40;
        fVar65 = DAT_004c5c40._4_4_;
        fVar66 = DAT_004c5c40._8_4_;
        fVar67 = DAT_004c5c40._12_4_;
        auVar56 = _DAT_004c5c10;
        for (uVar37 = 0; uVar37 != uVar31; uVar37 = uVar37 + 1) {
          pauVar40 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar37 * top_blob->elemsize + (long)top_blob->data);
          pp_Var6 = this->_vptr_Convolution1D_x86;
          for (iVar41 = 0; auVar46 = ZEXT816(0), iVar41 <= iVar4; iVar41 = iVar41 + 1) {
            p_Var5 = pp_Var6[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
              auVar70 = ZEXT816(0);
            }
            else {
              auVar70 = *(undefined1 (*) [16])
                         (*(long *)(&this->field_0x190 + (long)p_Var5) + uVar37 * 0x10);
            }
            pfVar43 = (float *)((this->weight_data_packed).cstep * uVar37 *
                                (this->weight_data_packed).elemsize +
                               (long)(this->weight_data_packed).data);
            for (uVar36 = 0; uVar36 != uVar33; uVar36 = uVar36 + 1) {
              p_Var7 = this->_vptr_Convolution1D_x86[-3];
              pfVar38 = (float *)((long)local_98.data +
                                 (long)iVar41 * (long)*(int *)(&this->field_0xdc + (long)p_Var7) * 4
                                 + (long)local_98.w *
                                   CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                                   uVar36);
              iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
              if (iVar39 < 1) {
                iVar39 = 0;
              }
              while (bVar44 = iVar39 != 0, iVar39 = iVar39 + -1, bVar44) {
                fVar52 = *pfVar38;
                auVar49._0_4_ = auVar70._0_4_ + *pfVar43 * fVar52;
                auVar49._4_4_ = auVar70._4_4_ + pfVar43[1] * fVar52;
                auVar49._8_4_ = auVar70._8_4_ + pfVar43[2] * fVar52;
                auVar49._12_4_ = auVar70._12_4_ + pfVar43[3] * fVar52;
                pfVar38 = pfVar38 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                pfVar43 = pfVar43 + 4;
                auVar70 = auVar49;
              }
            }
            fVar52 = auVar70._8_4_;
            fVar69 = auVar70._12_4_;
            auVar73 = auVar70;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var5) - 1U) goto switchD_004a137f_caseD_1;
            auVar73 = maxps(auVar70,auVar46);
            switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
            case 2:
              auVar46 = minps(auVar70,auVar46);
              fVar52 = **(float **)(&this->field_0xf8 + (long)p_Var5);
              auVar74._0_4_ = auVar73._0_4_ + fVar52 * auVar46._0_4_;
              auVar74._4_4_ = auVar73._4_4_ + fVar52 * auVar46._4_4_;
              auVar74._8_4_ = auVar73._8_4_ + fVar52 * auVar46._8_4_;
              auVar74._12_4_ = auVar73._12_4_ + fVar52 * auVar46._12_4_;
              auVar73 = auVar74;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
              uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
              auVar59._4_4_ = uVar1;
              auVar59._0_4_ = uVar1;
              auVar59._8_4_ = uVar1;
              auVar59._12_4_ = uVar1;
              auVar75._4_4_ = uVar2;
              auVar75._0_4_ = uVar2;
              auVar75._8_4_ = uVar2;
              auVar75._12_4_ = uVar2;
              auVar46 = maxps(auVar70,auVar59);
              auVar73 = minps(auVar46,auVar75);
              break;
            case 4:
              auVar50._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
              auVar50._8_4_ = -fVar52;
              auVar50._12_4_ = -fVar69;
              auVar46 = minps(auVar50,auVar62);
              auVar46 = maxps(auVar46,auVar56);
              fVar69 = auVar46._0_4_ * 1.442695 + 0.5;
              fVar82 = auVar46._4_4_ * 1.442695 + 0.5;
              fVar84 = auVar46._8_4_ * 1.442695 + 0.5;
              fVar78 = auVar46._12_4_ * 1.442695 + 0.5;
              fVar52 = (float)(int)fVar69;
              fVar81 = (float)(int)fVar82;
              fVar83 = (float)(int)fVar84;
              fVar68 = (float)(int)fVar78;
              fVar52 = fVar52 - (float)(-(uint)(fVar69 < fVar52) & (uint)fVar64);
              fVar81 = fVar81 - (float)(-(uint)(fVar82 < fVar81) & (uint)fVar65);
              fVar83 = fVar83 - (float)(-(uint)(fVar84 < fVar83) & (uint)fVar66);
              fVar68 = fVar68 - (float)(-(uint)(fVar78 < fVar68) & (uint)fVar67);
              fVar69 = fVar52 * -0.6931472 + auVar46._0_4_;
              fVar82 = fVar81 * -0.6931472 + auVar46._4_4_;
              fVar84 = fVar83 * -0.6931472 + auVar46._8_4_;
              fVar78 = fVar68 * -0.6931472 + auVar46._12_4_;
              auVar51._0_4_ = fVar69 * fVar69;
              auVar51._4_4_ = fVar82 * fVar82;
              auVar51._8_4_ = fVar84 * fVar84;
              auVar51._12_4_ = fVar78 * fVar78;
              fVar79 = (float)((int)fVar52 * 0x800000 + (int)fVar64) *
                       (fVar69 + fVar64 +
                       (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69
                         + 0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * auVar51._0_4_) +
                       fVar64;
              fVar80 = (float)((int)fVar81 * 0x800000 + (int)fVar65) *
                       (fVar82 + fVar65 +
                       (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82
                         + 0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5) * auVar51._4_4_) +
                       fVar65;
              fVar83 = (float)((int)fVar83 * 0x800000 + (int)fVar66) *
                       (fVar84 + fVar66 +
                       (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84
                         + 0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5) * auVar51._8_4_) +
                       fVar66;
              fVar84 = (float)((int)fVar68 * 0x800000 + (int)fVar67) *
                       (fVar78 + fVar67 +
                       (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78
                         + 0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5) * auVar51._12_4_) +
                       fVar67;
              auVar17._4_4_ = fVar80;
              auVar17._0_4_ = fVar79;
              auVar17._8_4_ = fVar83;
              auVar17._12_4_ = fVar84;
              auVar46 = rcpps(auVar51,auVar17);
              fVar52 = auVar46._0_4_;
              fVar69 = auVar46._4_4_;
              fVar81 = auVar46._8_4_;
              fVar82 = auVar46._12_4_;
              auVar73._0_4_ = (fVar64 - fVar79 * fVar52) * fVar52 + fVar52;
              auVar73._4_4_ = (fVar65 - fVar80 * fVar69) * fVar69 + fVar69;
              auVar73._8_4_ = (fVar66 - fVar83 * fVar81) * fVar81 + fVar81;
              auVar73._12_4_ = (fVar67 - fVar84 * fVar82) * fVar82 + fVar82;
              break;
            case 5:
              auVar46 = minps(auVar70,auVar62);
              auVar56 = maxps(auVar46,auVar56);
              fVar81 = auVar56._0_4_ * 1.442695 + 0.5;
              fVar82 = auVar56._4_4_ * 1.442695 + 0.5;
              fVar83 = auVar56._8_4_ * 1.442695 + 0.5;
              fVar84 = auVar56._12_4_ * 1.442695 + 0.5;
              fVar68 = (float)(int)fVar81;
              fVar78 = (float)(int)fVar82;
              fVar79 = (float)(int)fVar83;
              fVar80 = (float)(int)fVar84;
              fVar68 = fVar68 - (float)(-(uint)(fVar81 < fVar68) & (uint)fVar64);
              fVar78 = fVar78 - (float)(-(uint)(fVar82 < fVar78) & (uint)fVar65);
              fVar79 = fVar79 - (float)(-(uint)(fVar83 < fVar79) & (uint)fVar66);
              fVar80 = fVar80 - (float)(-(uint)(fVar84 < fVar80) & (uint)fVar67);
              fVar81 = auVar56._0_4_ - fVar68 * 0.6931472;
              fVar82 = auVar56._4_4_ - fVar78 * 0.6931472;
              fVar83 = auVar56._8_4_ - fVar79 * 0.6931472;
              fVar84 = auVar56._12_4_ - fVar80 * 0.6931472;
              auVar86._0_4_ =
                   (float)((int)fVar68 * 0x800000 + (int)fVar64) *
                   (fVar81 + fVar64 +
                   (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
                     0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81) + fVar64
              ;
              auVar86._4_4_ =
                   (float)((int)fVar78 * 0x800000 + (int)fVar65) *
                   (fVar82 + fVar65 +
                   (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
                     0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5) * fVar82 * fVar82) + fVar65
              ;
              auVar86._8_4_ =
                   (float)((int)fVar79 * 0x800000 + (int)fVar66) *
                   (fVar83 + fVar66 +
                   (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                     0.041665796) * fVar83 + 0.16666666) * fVar83 + 0.5) * fVar83 * fVar83) + fVar66
              ;
              auVar86._12_4_ =
                   (float)((int)fVar80 * 0x800000 + (int)fVar67) *
                   (fVar84 + fVar67 +
                   (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                     0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5) * fVar84 * fVar84) + fVar67
              ;
              auVar56 = maxps(auVar86,_DAT_004c5cb0);
              fVar81 = (float)(auVar56._0_4_ & 0x807fffff | 0x3f000000);
              fVar83 = (float)(auVar56._4_4_ & 0x807fffff | 0x3f000000);
              fVar68 = (float)(auVar56._8_4_ & 0x807fffff | 0x3f000000);
              fVar79 = (float)(auVar56._12_4_ & 0x807fffff | 0x3f000000);
              fVar82 = fVar81 + -1.0 + (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar81);
              fVar84 = fVar83 + -1.0 + (float)(-(uint)(fVar83 < 0.70710677) & (uint)fVar83);
              fVar78 = fVar68 + -1.0 + (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar68);
              fVar80 = fVar79 + -1.0 + (float)(-(uint)(fVar79 < 0.70710677) & (uint)fVar79);
              auVar57._0_8_ =
                   CONCAT44(-(uint)(auVar86._4_4_ <= 0.0),-(uint)(auVar86._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar57._8_4_ = -(uint)(auVar86._8_4_ <= 0.0) & 0x7fffffff;
              auVar57._12_4_ = -(uint)(auVar86._12_4_ <= 0.0) & 0x7fffffff;
              auVar13._4_4_ =
                   ~-(uint)(auVar86._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar56._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar83 < 0.70710677) & (uint)fVar65)) * 0.6931472 +
                           fVar84 + (((((((((fVar84 * 0.070376836 + -0.1151461) * fVar84 +
                                           0.116769984) * fVar84 + -0.12420141) * fVar84 +
                                         0.14249323) * fVar84 + -0.16668057) * fVar84 + 0.20000714)
                                       * fVar84 + -0.24999994) * fVar84 + 0.3333333) * fVar84 + -0.5
                                    ) * fVar84 * fVar84) * -2.0);
              auVar13._0_4_ =
                   ~-(uint)(auVar86._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar56._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar64)) * 0.6931472 +
                           fVar82 + (((((((((fVar82 * 0.070376836 + -0.1151461) * fVar82 +
                                           0.116769984) * fVar82 + -0.12420141) * fVar82 +
                                         0.14249323) * fVar82 + -0.16668057) * fVar82 + 0.20000714)
                                       * fVar82 + -0.24999994) * fVar82 + 0.3333333) * fVar82 + -0.5
                                    ) * fVar82 * fVar82) * -2.0);
              auVar13._8_4_ =
                   ~-(uint)(auVar86._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar56._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar66)) * 0.6931472 +
                           fVar78 + (((((((((fVar78 * 0.070376836 + -0.1151461) * fVar78 +
                                           0.116769984) * fVar78 + -0.12420141) * fVar78 +
                                         0.14249323) * fVar78 + -0.16668057) * fVar78 + 0.20000714)
                                       * fVar78 + -0.24999994) * fVar78 + 0.3333333) * fVar78 + -0.5
                                    ) * fVar78 * fVar78) * -2.0);
              auVar13._12_4_ =
                   ~-(uint)(auVar86._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar56._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar79 < 0.70710677) & (uint)fVar67)) * 0.6931472 +
                           fVar80 + (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 +
                                           0.116769984) * fVar80 + -0.12420141) * fVar80 +
                                         0.14249323) * fVar80 + -0.16668057) * fVar80 + 0.20000714)
                                       * fVar80 + -0.24999994) * fVar80 + 0.3333333) * fVar80 + -0.5
                                    ) * fVar80 * fVar80) * -2.0);
              auVar56 = minps(auVar57 | auVar13,auVar62);
              auVar56 = maxps(auVar56,_DAT_004c5c10);
              fVar81 = auVar56._0_4_ * 1.442695 + 0.5;
              fVar82 = auVar56._4_4_ * 1.442695 + 0.5;
              fVar83 = auVar56._8_4_ * 1.442695 + 0.5;
              fVar84 = auVar56._12_4_ * 1.442695 + 0.5;
              fVar68 = (float)(int)fVar81;
              fVar78 = (float)(int)fVar82;
              fVar79 = (float)(int)fVar83;
              fVar80 = (float)(int)fVar84;
              fVar68 = fVar68 - (float)(-(uint)(fVar81 < fVar68) & (uint)fVar64);
              fVar78 = fVar78 - (float)(-(uint)(fVar82 < fVar78) & (uint)fVar65);
              fVar79 = fVar79 - (float)(-(uint)(fVar83 < fVar79) & (uint)fVar66);
              fVar80 = fVar80 - (float)(-(uint)(fVar84 < fVar80) & (uint)fVar67);
              fVar81 = auVar56._0_4_ - fVar68 * 0.6931472;
              fVar82 = auVar56._4_4_ - fVar78 * 0.6931472;
              fVar83 = auVar56._8_4_ - fVar79 * 0.6931472;
              fVar84 = auVar56._12_4_ - fVar80 * 0.6931472;
              auVar58._0_4_ =
                   fVar81 + fVar64 +
                   (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
                     0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81;
              auVar58._4_4_ =
                   fVar82 + fVar65 +
                   (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
                     0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5) * fVar82 * fVar82;
              auVar58._8_4_ =
                   fVar83 + fVar66 +
                   (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                     0.041665796) * fVar83 + 0.16666666) * fVar83 + 0.5) * fVar83 * fVar83;
              auVar58._12_4_ =
                   fVar84 + fVar67 +
                   (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                     0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5) * fVar84 * fVar84;
              fVar68 = (float)((int)fVar68 * 0x800000 + (int)fVar64) * auVar58._0_4_ + fVar64;
              fVar78 = (float)((int)fVar78 * 0x800000 + (int)fVar65) * auVar58._4_4_ + fVar65;
              fVar79 = (float)((int)fVar79 * 0x800000 + (int)fVar66) * auVar58._8_4_ + fVar66;
              fVar80 = (float)((int)fVar80 * 0x800000 + (int)fVar67) * auVar58._12_4_ + fVar67;
              auVar16._4_4_ = fVar78;
              auVar16._0_4_ = fVar68;
              auVar16._8_4_ = fVar79;
              auVar16._12_4_ = fVar80;
              auVar56 = rcpps(auVar58,auVar16);
              fVar81 = auVar56._0_4_;
              fVar82 = auVar56._4_4_;
              fVar83 = auVar56._8_4_;
              fVar84 = auVar56._12_4_;
              auVar77._0_4_ = fVar81 + fVar81 + -1.0 + (2.0 - fVar68 * (fVar81 + fVar81)) * fVar81;
              auVar77._4_4_ = fVar82 + fVar82 + -1.0 + (2.0 - fVar78 * (fVar82 + fVar82)) * fVar82;
              auVar77._8_4_ = fVar83 + fVar83 + -1.0 + (2.0 - fVar79 * (fVar83 + fVar83)) * fVar83;
              auVar77._12_4_ = fVar84 + fVar84 + -1.0 + (2.0 - fVar80 * (fVar84 + fVar84)) * fVar84;
              auVar56 = _DAT_004c5c10;
              goto LAB_004a16e2;
            case 6:
              fVar81 = **(float **)(&this->field_0xf8 + (long)p_Var5);
              fVar82 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
              auVar76._0_4_ = fVar81 * auVar70._0_4_ + fVar82;
              auVar76._4_4_ = fVar81 * auVar70._4_4_ + fVar82;
              auVar76._8_4_ = fVar81 * fVar52 + fVar82;
              auVar76._12_4_ = fVar81 * fVar69 + fVar82;
              auVar46 = maxps(auVar76,auVar46);
              auVar77 = minps(auVar46,auVar72);
LAB_004a16e2:
              auVar73._0_4_ = auVar77._0_4_ * auVar70._0_4_;
              auVar73._4_4_ = auVar77._4_4_ * auVar70._4_4_;
              auVar73._8_4_ = auVar77._8_4_ * fVar52;
              auVar73._12_4_ = auVar77._12_4_ * fVar69;
            }
switchD_004a137f_caseD_1:
            *pauVar40 = auVar73;
            pauVar40 = pauVar40 + 1;
          }
        }
      }
      if ((iVar3 == 4) && (bVar32 != 0)) {
        local_40 = top_blob->data;
        local_48 = (long)top_blob->w * top_blob->elemsize;
        uVar33 = 0;
        if (0 < iVar29) {
          uVar33 = (ulong)(uint)iVar29;
        }
        local_38 = 0;
        if (0 < iVar34) {
          local_38 = uVar30;
        }
        for (uVar31 = 0; pvVar11 = local_40, uVar31 != local_38; uVar31 = uVar31 + 1) {
          lVar35 = local_48 * uVar31;
          sVar8 = (this->weight_data_packed).cstep;
          sVar9 = (this->weight_data_packed).elemsize;
          pp_Var6 = this->_vptr_Convolution1D_x86;
          pvVar10 = (this->weight_data_packed).data;
          for (lVar42 = 0; lVar42 <= iVar4; lVar42 = lVar42 + 1) {
            p_Var5 = pp_Var6[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
              auVar60 = ZEXT812(0);
            }
            else {
              auVar60._4_8_ = 0;
              auVar60._0_4_ = *(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) + uVar31 * 4);
            }
            auVar62._12_4_ = 0;
            auVar62._0_12_ = auVar60;
            pfVar43 = (float *)(sVar8 * uVar31 * sVar9 + (long)pvVar10);
            for (uVar37 = 0; fVar64 = auVar62._0_4_, uVar37 != uVar33; uVar37 = uVar37 + 1) {
              p_Var7 = this->_vptr_Convolution1D_x86[-3];
              pfVar38 = (float *)((long)local_98.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * (int)lVar42 * 4
                                       ) * 4 +
                                 (long)local_98.w *
                                 CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                                 uVar37);
              iVar41 = *(int *)(&this->field_0xd4 + (long)p_Var7);
              if (iVar41 < 1) {
                iVar41 = 0;
              }
              while (bVar44 = iVar41 != 0, iVar41 = iVar41 + -1, bVar44) {
                auVar62._0_4_ =
                     auVar62._0_4_ + pfVar43[2] * pfVar38[2] + *pfVar43 * *pfVar38 +
                     pfVar43[3] * pfVar38[3] + pfVar43[1] * pfVar38[1];
                pfVar38 = pfVar38 + (long)*(int *)(&this->field_0xd8 + (long)p_Var7) * 4;
                pfVar43 = pfVar43 + 4;
              }
            }
            auVar45 = auVar62;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
            case 1:
              if (fVar64 <= 0.0) {
                auVar18._12_4_ = 0;
                auVar18._0_12_ = auVar62._4_12_;
                auVar45 = auVar18 << 0x20;
              }
              break;
            case 2:
              auVar45 = ZEXT416((uint)((float)(-(uint)(0.0 < fVar64) & 0x3f800000 |
                                              ~-(uint)(0.0 < fVar64) &
                                              **(uint **)(&this->field_0xf8 + (long)p_Var5)) *
                                      fVar64));
              break;
            case 3:
              fVar65 = **(float **)(&this->field_0xf8 + (long)p_Var5);
              if (fVar64 <= fVar65) {
                auVar62._0_4_ = fVar65;
              }
              fVar64 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
              auVar45 = auVar62;
              if (fVar64 < auVar62._0_4_) {
LAB_004a19f0:
                auVar45 = ZEXT416((uint)fVar64);
              }
              break;
            case 4:
              if (88.37626 <= fVar64) {
                fVar64 = 88.37626;
              }
              fVar64 = expf((float)(-(uint)(fVar64 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar64 < -88.37626) & (uint)-fVar64));
              auVar45 = ZEXT416((uint)(1.0 / (fVar64 + 1.0)));
              break;
            case 5:
              fVar65 = expf(fVar64);
              fVar65 = logf(fVar65 + 1.0);
              fVar65 = tanhf(fVar65);
              auVar45._0_4_ = fVar65 * fVar64;
              auVar45._4_12_ = extraout_var;
              break;
            case 6:
              fVar65 = **(float **)(&this->field_0xf8 + (long)p_Var5);
              fVar66 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
              fVar67 = -fVar66 / fVar65;
              auVar45 = ZEXT816(0);
              if ((fVar67 <= fVar64) && (auVar45 = auVar62, fVar64 <= fVar67 + 1.0 / fVar65)) {
                fVar64 = (fVar65 * fVar64 + fVar66) * fVar64;
                goto LAB_004a19f0;
              }
            }
            *(int *)((long)pvVar11 + lVar42 * 4 + lVar35) = auVar45._0_4_;
          }
        }
      }
      local_b8 = 0;
      if (bVar32 == 1 && iVar3 == 1) {
        iVar3 = top_blob->w;
        sVar8 = top_blob->elemsize;
        uVar33 = 0;
        if (0 < iVar29) {
          uVar33 = (ulong)(uint)iVar29;
        }
        pvVar11 = top_blob->data;
        local_b8 = 0;
        if (iVar34 < 1) {
          uVar30 = 0;
        }
        for (uVar31 = 0; uVar31 != uVar30; uVar31 = uVar31 + 1) {
          pp_Var6 = this->_vptr_Convolution1D_x86;
          for (lVar35 = 0; lVar35 <= iVar4; lVar35 = lVar35 + 1) {
            p_Var5 = pp_Var6[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
              auVar61 = ZEXT812(0);
            }
            else {
              auVar61._4_8_ = 0;
              auVar61._0_4_ = *(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) + uVar31 * 4);
            }
            auVar63._12_4_ = 0;
            auVar63._0_12_ = auVar61;
            iVar34 = *(int *)(&this->field_0xd4 + (long)p_Var5);
            pfVar43 = (float *)((long)(iVar29 * (int)uVar31 * iVar34) * 4 +
                               *(long *)(&this->field_0x148 + (long)p_Var5));
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            for (uVar37 = 0; fVar64 = auVar63._0_4_, uVar37 != uVar33; uVar37 = uVar37 + 1) {
              pfVar38 = (float *)((long)local_98.data +
                                 (long)*(int *)(&this->field_0xdc + (long)p_Var5) *
                                 (long)(int)lVar35 * 4 +
                                 (long)local_98.w *
                                 CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                                 uVar37);
              iVar41 = iVar34;
              while (bVar44 = iVar41 != 0, iVar41 = iVar41 + -1, bVar44) {
                auVar63._0_4_ = auVar63._0_4_ + *pfVar43 * *pfVar38;
                pfVar38 = pfVar38 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                pfVar43 = pfVar43 + 1;
              }
            }
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
            case 1:
              if (fVar64 <= 0.0) {
                auVar19._12_4_ = 0;
                auVar19._0_12_ = auVar63._4_12_;
                auVar63 = auVar19 << 0x20;
              }
            default:
switchD_004a1b76_default:
              fVar65 = auVar63._0_4_;
              break;
            case 2:
              fVar65 = (float)(-(uint)(0.0 < fVar64) & 0x3f800000 |
                              ~-(uint)(0.0 < fVar64) & **(uint **)(&this->field_0xf8 + (long)p_Var5)
                              ) * fVar64;
              break;
            case 3:
              fVar65 = **(float **)(&this->field_0xf8 + (long)p_Var5);
              if (fVar64 <= fVar65) {
                auVar63._0_4_ = fVar65;
              }
              fVar65 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
              if (auVar63._0_4_ <= fVar65) {
                fVar65 = auVar63._0_4_;
              }
              break;
            case 4:
              if (88.37626 <= fVar64) {
                fVar64 = 88.37626;
              }
              fVar64 = expf((float)(-(uint)(fVar64 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar64 < -88.37626) & (uint)-fVar64));
              fVar65 = 1.0 / (fVar64 + 1.0);
              break;
            case 5:
              fVar65 = expf(fVar64);
              fVar65 = logf(fVar65 + 1.0);
              fVar65 = tanhf(fVar65);
              fVar65 = fVar65 * fVar64;
              break;
            case 6:
              fVar66 = **(float **)(&this->field_0xf8 + (long)p_Var5);
              fVar67 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
              fVar52 = -fVar67 / fVar66;
              fVar65 = 0.0;
              if (fVar52 <= fVar64) {
                if (fVar52 + 1.0 / fVar66 < fVar64) goto switchD_004a1b76_default;
                fVar65 = (fVar66 * fVar64 + fVar67) * fVar64;
              }
            }
            *(float *)((long)pvVar11 + lVar35 * 4 + (long)iVar3 * sVar8 * uVar31) = fVar65;
          }
        }
      }
    }
  }
  piVar28 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar28 != (int *)0x0) {
    LOCK();
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_b8;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}